

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

char32_t argo::utf8::parse_hex(string *src,size_t *src_index)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char32_t res;
  size_t *src_index_local;
  string *src_local;
  
  cVar1 = next_char(src,src_index);
  uVar2 = from_hex(cVar1);
  cVar1 = next_char(src,src_index);
  uVar3 = from_hex(cVar1);
  cVar1 = next_char(src,src_index);
  uVar4 = from_hex(cVar1);
  cVar1 = next_char(src,src_index);
  uVar5 = from_hex(cVar1);
  return uVar5 | uVar4 << 4 | uVar3 << 8 | uVar2 << 0xc;
}

Assistant:

char32_t utf8::parse_hex(const string &src, size_t &src_index)
{
    char32_t res = 0;

    res |= from_hex(next_char(src, src_index)) << 12;
    res |= from_hex(next_char(src, src_index)) << 8;
    res |= from_hex(next_char(src, src_index)) << 4;
    res |= from_hex(next_char(src, src_index));

    return res;
}